

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

bool hypergeometric_check(int n,int m,int l)

{
  char *pcVar1;
  
  if (l < n || n < 0) {
    pcVar1 = "  Input N is out of range.\n";
  }
  else {
    if (-1 < m && m <= l) {
      return true;
    }
    pcVar1 = "  Input M is out of range.\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," \n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"HYPERGEOMETRIC_CHECK - Warning!\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,0x1b);
  return false;
}

Assistant:

bool hypergeometric_check ( int n, int m, int l )

//****************************************************************************80
//
//  Purpose:
//
//    HYPERGEOMETRIC_CHECK checks the parameters of the Hypergeometric CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of balls selected.
//    0 <= N <= L.
//
//    Input, int M, the number of white balls in the population.
//    0 <= M <= L.
//
//    Input, int L, the number of balls to select from.
//    0 <= L.
//
//    Output, bool HYPERGEOMETRIC_CHECK, is true if the parameters are legal.
//
{
  if ( n < 0 || l < n )
  {
    cout << " \n";
    cout << "HYPERGEOMETRIC_CHECK - Warning!\n";
    cout << "  Input N is out of range.\n";
    return false;
  }

  if ( m < 0 || l < m )
  {
    cout << " \n";
    cout << "HYPERGEOMETRIC_CHECK - Warning!\n";
    cout << "  Input M is out of range.\n";
    return false;
  }

  if ( l < 0 )
  {
    cout << " \n";
    cout << "HYPERGEOMETRIC_CHECK - Warning!\n";
    cout << "  Input L is out of range.\n";
    return false;
  }

  return true;
}